

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::logMessage
          (RootExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  bool bVar1;
  String *params_6;
  char *__buf;
  size_t sVar2;
  Repeat<char> RVar3;
  StringPtr SVar4;
  char *in_stack_ffffffffffffff58;
  char *local_98;
  char *local_90;
  ssize_t n;
  StringPtr textPtr;
  undefined1 local_5a [2];
  kj local_58 [8];
  size_t local_50;
  String local_48;
  String *local_30;
  String *text_local;
  int contextDepth_local;
  int line_local;
  char *file_local;
  RootExceptionCallback *pRStack_10;
  LogSeverity severity_local;
  RootExceptionCallback *this_local;
  
  local_5a[1] = 0x5f;
  local_30 = text;
  text_local._0_4_ = contextDepth;
  text_local._4_4_ = line;
  _contextDepth_local = file;
  file_local._4_4_ = severity;
  pRStack_10 = this;
  RVar3 = repeat<char>(local_5a + 1,(long)contextDepth);
  local_50 = RVar3.count;
  local_58[0] = (kj)RVar3.value;
  params_6 = mv<kj::String>(local_30);
  local_5a[0] = 10;
  str<kj::Repeat<char>,char_const*&,char_const(&)[2],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String,char>
            (&local_48,local_58,(Repeat<char> *)&contextDepth_local,(char **)":",
             (char (*) [2])((long)&text_local + 4),(int *)0x336af5,
             (char (*) [3])((long)&file_local + 4),(LogSeverity *)0x336af5,(char (*) [3])params_6,
             (String *)local_5a,in_stack_ffffffffffffff58);
  String::operator=(local_30,&local_48);
  String::~String(&local_48);
  StringPtr::StringPtr((StringPtr *)&n,local_30);
  while( true ) {
    bVar1 = StringPtr::operator!=((StringPtr *)&n,(void *)0x0);
    if (!bVar1) {
      return;
    }
    __buf = StringPtr::begin((StringPtr *)&n);
    sVar2 = StringPtr::size((StringPtr *)&n);
    sVar2 = write(2,__buf,sVar2);
    if ((long)sVar2 < 1) break;
    SVar4 = StringPtr::slice((StringPtr *)&n,sVar2);
    local_98 = SVar4.content.ptr;
    n = (ssize_t)local_98;
    local_90 = (char *)SVar4.content.size_;
    textPtr.content.ptr = local_90;
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    text = str(kj::repeat('_', contextDepth), file, ":", line, ": ", severity, ": ",
               mv(text), '\n');

    StringPtr textPtr = text;

    while (textPtr != nullptr) {
      miniposix::ssize_t n = miniposix::write(STDERR_FILENO, textPtr.begin(), textPtr.size());
      if (n <= 0) {
        // stderr is broken.  Give up.
        return;
      }
      textPtr = textPtr.slice(n);
    }
  }